

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputVenueMessageContent.h
# Opt level: O3

void __thiscall
TgBot::InputVenueMessageContent::InputVenueMessageContent(InputVenueMessageContent *this)

{
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"InputVenueMessageContent","")
  ;
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputMessageContent_002a6a18;
  (this->super_InputMessageContent).type._M_dataplus._M_p =
       (pointer)&(this->super_InputMessageContent).type.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_InputMessageContent).type,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputVenueMessageContent_002a6b10;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  (this->foursquareId)._M_dataplus._M_p = (pointer)&(this->foursquareId).field_2;
  (this->foursquareId)._M_string_length = 0;
  (this->foursquareId).field_2._M_local_buf[0] = '\0';
  (this->foursquareType)._M_dataplus._M_p = (pointer)&(this->foursquareType).field_2;
  (this->foursquareType)._M_string_length = 0;
  (this->foursquareType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputVenueMessageContent() :
        InputMessageContent("InputVenueMessageContent")
    {}